

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZConsReader.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsReader::ZConsReader(ZConsReader *this,SimInfo *info)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *this_00;
  long in_RSI;
  long *in_RDI;
  int i;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  int nZconstraints;
  Globals *simParam;
  string zconsFileName_;
  Globals *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> *this_01;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int local_ac;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> local_a8;
  int local_8c;
  Globals *local_88;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(in_RDI);
  in_RDI[0x41] = local_10;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x371096);
  std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::vector
            ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)0x3710ac);
  SimInfo::getFinalConfigFileName_abi_cxx11_((SimInfo *)in_stack_fffffffffffffee8);
  getPrefix((string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)in_RDI,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_88 = SimInfo::getSimParams((SimInfo *)in_RDI[0x41]);
    this_00 = (vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)
              Globals::getNZconsStamps((Globals *)0x371273);
    local_8c = (int)this_00;
    Globals::getZconsStamps(in_stack_fffffffffffffee8);
    for (local_ac = 0; local_ac < local_8c; local_ac = local_ac + 1) {
      this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x42);
      std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
                (&local_a8,(long)local_ac);
      ZConsStamp::getMolIndex((ZConsStamp *)0x3712d6);
      std::vector<int,_std::allocator<int>_>::push_back
                (this_01,(value_type_conflict1 *)in_stack_fffffffffffffee8);
    }
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~vector(this_00);
    std::__cxx11::string::~string(local_30);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"open ");
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3,"error");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

ZConsReader::ZConsReader(SimInfo* info) : info_(info) {
    std::string zconsFileName_ =
        getPrefix(info_->getFinalConfigFileName()) + ".fz";
    istream_.open(zconsFileName_.c_str());

    if (!istream_) {
      std::cerr << "open " << zconsFileName_ << "error" << std::endl;
      exit(1);
    }

    Globals* simParam              = info_->getSimParams();
    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      allZmols_.push_back(stamp[i]->getMolIndex());
    }
  }